

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall
TargetPropertyEntryFinder::operator()(TargetPropertyEntryFinder *this,TargetPropertyEntry *entry)

{
  bool bVar1;
  cmCompiledGeneratorExpression *this_00;
  string *arg;
  size_type __n;
  cmMakefile *mf;
  __normal_iterator<cmSourceFileLocation_*,_std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>_>
  local_b0;
  LocationMatcher local_a8;
  __normal_iterator<cmSourceFileLocation_*,_std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>_>
  local_a0;
  __normal_iterator<cmSourceFileLocation_*,_std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>_>
  local_98;
  __normal_iterator<cmSourceFileLocation_*,_std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>_>
  local_90;
  cmSourceFileLocation *local_88;
  CreateLocation local_80;
  __normal_iterator<cmSourceFileLocation_*,_std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>_>
  local_78;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  allocator<cmSourceFileLocation> local_59;
  undefined1 local_58 [8];
  vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> locations;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  TargetPropertyEntry *entry_local;
  TargetPropertyEntryFinder *this_local;
  
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)entry;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30);
  this_00 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                      ((auto_ptr<cmCompiledGeneratorExpression> *)
                       files.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  arg = cmCompiledGeneratorExpression::GetInput_abi_cxx11_(this_00);
  cmSystemTools::ExpandListArgument
            (arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_30,false);
  __n = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_30);
  std::allocator<cmSourceFileLocation>::allocator(&local_59);
  std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::vector
            ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)local_58,__n,
             &local_59);
  std::allocator<cmSourceFileLocation>::~allocator(&local_59);
  local_68._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_30);
  local_70._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30);
  local_78._M_current =
       (cmSourceFileLocation *)
       std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::begin
                 ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)local_58);
  mf = cmSourceFileLocation::GetMakefile(this->Needle);
  CreateLocation::CreateLocation(&local_80,mf);
  local_88 = (cmSourceFileLocation *)
             std::
             transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<cmSourceFileLocation*,std::vector<cmSourceFileLocation,std::allocator<cmSourceFileLocation>>>,CreateLocation>
                       (local_68,local_70,local_78,local_80);
  local_98._M_current =
       (cmSourceFileLocation *)
       std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::begin
                 ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)local_58);
  local_a0._M_current =
       (cmSourceFileLocation *)
       std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::end
                 ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)local_58);
  LocationMatcher::LocationMatcher(&local_a8,this->Needle);
  local_90 = std::
             find_if<__gnu_cxx::__normal_iterator<cmSourceFileLocation*,std::vector<cmSourceFileLocation,std::allocator<cmSourceFileLocation>>>,LocationMatcher>
                       (local_98,local_a0,local_a8);
  local_b0._M_current =
       (cmSourceFileLocation *)
       std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::end
                 ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)local_58);
  bVar1 = __gnu_cxx::operator!=(&local_90,&local_b0);
  std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::~vector
            ((vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> *)local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_30);
  return bVar1;
}

Assistant:

bool operator()(cmTargetInternals::TargetPropertyEntry* entry)
  {
    std::vector<std::string> files;
    cmSystemTools::ExpandListArgument(entry->ge->GetInput(), files);
    std::vector<cmSourceFileLocation> locations(files.size());
    std::transform(files.begin(), files.end(), locations.begin(),
                   CreateLocation(this->Needle.GetMakefile()));

    return std::find_if(locations.begin(), locations.end(),
        LocationMatcher(this->Needle)) != locations.end();
  }